

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_binary_op.cxx
# Opt level: O2

void __thiscall HAXX_BINARY_OP::real_binary_add::test_method(real_binary_add *this)

{
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined **local_290;
  undefined1 local_288;
  undefined8 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x17);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_58 = "";
  local_2a8 = 0xc00cb851eb851eb8;
  local_298 = 0xc00cb851eb851eb8;
  local_2a0 = 0x3d719799812dea11;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_60,0x17,1,8,&local_2a8,"p.real()",&local_298,"q.real() + x",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x18);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0x4000000000000000;
  local_298 = 0x4000000000000000;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_88 = "";
  local_2a0 = 0x3d719799812dea11;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_90,0x18,1,8,&local_2a8,"p.imag_i()",&local_298,"q.imag_i()",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x19);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_2a0 = 0x3d719799812dea11;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0x4008000000000000;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_b8 = "";
  local_298 = 0x4008000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_c0,0x19,1,8,&local_2a8,"p.imag_j()",&local_298,"q.imag_j()",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1a);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_298 = 0x4010000000000000;
  local_2a0 = 0x3d719799812dea11;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0x4010000000000000;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_e8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_f0,0x1a,1,8,&local_2a8,"p.imag_k()",&local_298,"q.imag_k()",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1c);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_2a0 = 0x3d719799812dea11;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0xc00cb851eb851eb8;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_118 = "";
  local_298 = 0xc00cb851eb851eb8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_120,0x1c,1,8,&local_2a8,"r.real()",&local_298,"q.real() + x",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1d);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_148 = "";
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_298 = 0x4000000000000000;
  local_2a8 = 0x4000000000000000;
  local_2a0 = 0x3d719799812dea11;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_150,0x1d,1,8,&local_2a8,"r.imag_i()",&local_298,"q.imag_i()",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1e);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0x4008000000000000;
  local_298 = 0x4008000000000000;
  local_2a0 = 0x3d719799812dea11;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_178 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_180,0x1e,1,8,&local_2a8,"r.imag_j()",&local_298,"q.imag_j()",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1f);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_2a0 = 0x3d719799812dea11;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0x4010000000000000;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1a8 = "";
  local_298 = 0x4010000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_1b0,0x1f,1,8,&local_2a8,"r.imag_k()",&local_298,"q.imag_k()",
             &local_2a0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x21);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_2a8 = 0x3ff0000000000000;
  local_298 = 0x3ff0000000000000;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a0 = 0x3d719799812dea11;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_1e0,0x21,1,8,&local_2a8,"q.real()",&local_298,"1.",&local_2a0,
             "::boost::math::fpc::percent_tolerance(1e-12)");
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x22);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0x4000000000000000;
  local_298 = 0x4000000000000000;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_208 = "";
  local_2a0 = 0x3d719799812dea11;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_210,0x22,1,8,&local_2a8,"q.imag_i()",&local_298,"2.",&local_2a0,
             "::boost::math::fpc::percent_tolerance(1e-12)");
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x23);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_298 = 0x4008000000000000;
  local_2a0 = 0x3d719799812dea11;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_2a8 = 0x4008000000000000;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_238 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_240,0x23,1,8,&local_2a8,"q.imag_j()",&local_298,"3.",&local_2a0,
             "::boost::math::fpc::percent_tolerance(1e-12)");
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x24);
  local_288 = 0;
  local_290 = &PTR__lazy_ostream_00150bc8;
  local_2a0 = 0x3d719799812dea11;
  local_280 = &boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_268 = "";
  local_2a8 = 0x4010000000000000;
  local_298 = 0x4010000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_290,&local_270,0x24,1,8,&local_2a8,"q.imag_k()",&local_298,"4.",&local_2a0,
             "::boost::math::fpc::percent_tolerance(1e-12)");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(real_binary_add)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.),p,r;
  double x = -4.59;
  p = q + x;
  r = x + q;

  BOOST_CHECK_CLOSE(p.real(),  q.real() + x, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_i(),q.imag_i()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_j(),q.imag_j()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_k(),q.imag_k()  , COMPARE_TOL);

  BOOST_CHECK_CLOSE(r.real(),  q.real() + x, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_i(),q.imag_i()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_j(),q.imag_j()  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_k(),q.imag_k()  , COMPARE_TOL);

  BOOST_CHECK_CLOSE(q.real(),  1., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_i(),2., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_j(),3., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_k(),4., COMPARE_TOL);
}